

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EtherCATStack.cpp
# Opt level: O0

EC_T_DWORD
EtherCATStack(CAtEmLogging *poLog,EC_T_CNF_TYPE eCnfType,EC_T_PBYTE pbyCnfData,
             EC_T_DWORD dwCnfDataLen,EC_T_DWORD dwBusCycleTimeUsec,EC_T_INT nVerbose,
             EC_T_DWORD dwDuration,EC_T_LINK_PARMS *poLinkParms,void *pvTimingEvent,
             EC_T_DWORD dwCpuIndex,EC_T_BOOL bEnaPerfJobs,EC_T_WORD wServerPort,
             EC_T_LINK_PARMS *poLinkParmsRed,EC_T_OS_PARMS *poOsParms,EC_T_DCM_MODE eDcmMode,
             EC_T_BOOL bDcmCtlOff,_func_void_EC_T_BYTE_ptr_EC_T_BYTE_ptr *callbackFctPtr,
             char *licenseKey)

{
  CAtEmLogging *pCVar1;
  int iVar2;
  int iVar3;
  EC_T_DWORD EVar4;
  EC_T_INT EVar5;
  EC_T_STATE EVar6;
  EC_T_BOOL EVar7;
  CEmNotification *this;
  size_t sVar8;
  EC_T_CHAR *pEVar9;
  undefined8 uVar10;
  bool bVar11;
  CEmNotification *local_2b8;
  EC_T_INT64 local_2b0;
  EC_T_INT64 nTimeStampDiff;
  EC_T_BOOL bResetDcmStatus;
  EC_T_BOOL bLogDcmStatus;
  EC_T_INT nDiffMax_1;
  EC_T_INT nDiffAvg_1;
  EC_T_INT nDiffCur_1;
  EC_T_DWORD dwDcmStatus_1;
  EC_T_INT nDiffMax;
  EC_T_INT nDiffAvg;
  EC_T_INT nDiffCur;
  EC_T_DWORD dwDcmStatus;
  undefined1 auStack_278 [2];
  ETHERNET_ADDRESS oSrcMacAddress;
  EC_T_REGISTERRESULTS oRegisterResults;
  EC_T_BOOL bLogEnabled;
  EC_T_DCM_CONFIG oDcmConfig;
  EC_T_DC_CONFIGURE oDcConfigure;
  EC_T_INIT_MASTER_PARMS oInitParms;
  undefined4 local_e8;
  EC_T_WORD local_e4;
  ATEMRAS_T_SRVPARMS oRemoteApiConfig;
  EC_T_CPUSET CpuSet;
  EC_T_INT nDcmCtlSetVal;
  EC_T_BOOL bFirstDcmStatus;
  CEcTimer oDcmStatusTimer;
  CEmNotification *local_60;
  CEmNotification *pNotification;
  CEcTimer oTimeout;
  EC_T_DWORD local_34;
  EC_T_BOOL bRes;
  EC_T_DWORD dwRes;
  EC_T_DWORD dwRetVal;
  EC_T_INT nVerbose_local;
  EC_T_DWORD dwBusCycleTimeUsec_local;
  EC_T_DWORD dwCnfDataLen_local;
  EC_T_PBYTE pbyCnfData_local;
  EC_T_CNF_TYPE eCnfType_local;
  CAtEmLogging *poLog_local;
  
  callbackFct = callbackFctPtr;
  bRes = 0;
  CEcTimer::CEcTimer((CEcTimer *)&pNotification);
  local_60 = (CEmNotification *)0x0;
  CEcTimer::CEcTimer((CEcTimer *)&nDcmCtlSetVal);
  CpuSet = 1;
  iVar2 = ((dwBusCycleTimeUsec << 1) / 3) * 1000;
  S_bEnaPerfJobs = bEnaPerfJobs;
  S_DemoThreadParam.pvTimingEvent = pvTimingEvent;
  S_poLog = poLog;
  CAtEmLogging::LogMsg(poLog,"nVerbose: %d\n",(ulong)(uint)nVerbose);
  if (poLinkParms->eLinkMode == EcLinkMode_POLLING) {
    iVar3 = OsSetThreadAffinity(0,1 << ((byte)dwCpuIndex & 0x1f));
    if (iVar3 == 0) {
      bRes = -0x67eefff5;
      CAtEmLogging::LogError
                (S_poLog,"Error: Set thread affinitiy, invalid CPU index %d\n",(ulong)dwCpuIndex);
    }
    else {
      this = (CEmNotification *)operator_new(0x7768,(nothrow_t *)&std::nothrow);
      local_2b8 = (CEmNotification *)0x0;
      if (this != (CEmNotification *)0x0) {
        CEmNotification::CEmNotification(this,0,poLog,0);
        local_2b8 = this;
      }
      local_60 = local_2b8;
      if (local_2b8 == (CEmNotification *)0x0) {
        bRes = -0x67eefff6;
      }
      else {
        CEmNotification::Verbose(local_2b8,nVerbose);
        if (S_bEnaPerfJobs != 0) {
          ecatPerfMeasInit(&S_TscMeasDesc,0,7);
          ecatPerfMeasEnable(&S_TscMeasDesc);
        }
        EVar4 = myAppInit(poLog,nVerbose);
        if (EVar4 == 0) {
          if (wServerPort != 0xffff) {
            memset(&local_e8,0,0x3c);
            local_e8 = 0;
            local_e4 = wServerPort;
            oRemoteApiConfig.oAddr.dwAddr = 2;
            oRemoteApiConfig.wPort = 5000;
            oRemoteApiConfig.wReserved = 0;
            oRemoteApiConfig.dwCycleTime = 6000;
            oRemoteApiConfig.dwWDTOLimit = 0x27;
            oRemoteApiConfig.dwReConTOLimit = 0x27;
            oRemoteApiConfig._32_8_ = local_2b8;
            oRemoteApiConfig.pvNotifCtxt = RasNotifyWrapper;
            oRemoteApiConfig.dwMasterPrio = 100;
            oRemoteApiConfig.dwClientPrio = 0x32;
            oRemoteApiConfig.dwConcNotifyAmount = 3000;
            oRemoteApiConfig.pfNotification._0_4_ = 500;
            if (nVerbose != 0) {
              CAtEmLogging::LogMsg(S_poLog,"Start Remote API Server now\n");
            }
            memcpy((void *)((long)oInitParms.dwReserved + 0xd),&local_e8,0x3c);
            iVar3 = emRasSrvStart(&S_pvRemoteApiSrvH);
            if (iVar3 != 0) {
              CAtEmLogging::LogError(S_poLog,"ERROR: Cannot spawn Remote API Server\n");
            }
            S_bRasSrvStarted = 1;
          }
          if (nVerbose != 0) {
            CAtEmLogging::LogMsg(S_poLog,"==========================");
            CAtEmLogging::LogMsg(S_poLog,"Initialize EtherCAT Master");
            CAtEmLogging::LogMsg(S_poLog,"==========================");
          }
          memset(oDcConfigure.dwReserved + 1,0,0x78);
          oDcConfigure.dwReserved[1] = 0xaec29106;
          oDcConfigure._44_4_ = 0x78;
          oInitParms.pOsParms = (_EC_T_OS_PARMS *)poLinkParms;
          oInitParms.pLinkParms = poLinkParmsRed;
          oInitParms.pLinkParmsRed._4_4_ = 0x100;
          oInitParms.dwBusCycleTimeUsec = 0x20;
          oInitParms.dwMaxQueuedEthFrames = 0x20;
          if (dwBusCycleTimeUsec < 1000) {
            oInitParms.dwAdditionalEoEEndpoints = 1;
          }
          else {
            oInitParms.dwAdditionalEoEEndpoints = 3;
          }
          oInitParms.dwMaxSentQueuedFramesPerCycle = 5;
          oInitParms.dwEcatCmdMaxRetries = 1000;
          oInitParms.dwEcatCmdTimeout = 0xfa;
          oInitParms._79_8_ = CAtEmLogging::OsDbgMsgHookWrapper;
          oInitParms._0_8_ = poOsParms;
          oInitParms.pLinkParmsRed._0_4_ = dwBusCycleTimeUsec;
          oInitParms._75_4_ = nVerbose;
          EVar4 = ecatInitMaster((EC_T_INIT_MASTER_PARMS *)(oDcConfigure.dwReserved + 1));
          pCVar1 = S_poLog;
          if (EVar4 == 0) {
            sVar8 = strlen(licenseKey);
            if (1 < sVar8) {
              CAtEmLogging::LogMsg(S_poLog,"LicenseKey: %s",licenseKey);
              EVar4 = ecatSetLicenseKey(licenseKey);
              pCVar1 = S_poLog;
              if (EVar4 == 0) {
                CAtEmLogging::LogMsg(S_poLog,"ACTIVATION SUCCESSFULL");
              }
              else {
                uVar10 = ecatGetText(EVar4);
                CAtEmLogging::LogError
                          (pCVar1,"ACTIVATION FAILED (Result = %s 0x%x)",uVar10,(ulong)EVar4);
              }
            }
            S_DemoThreadParam.bJobThreadRunning = 0;
            S_DemoThreadParam.bJobThreadShutdown = 0;
            S_DemoThreadParam.pLogInst = S_poLog;
            S_DemoThreadParam.pNotInst = local_2b8;
            S_DemoThreadParam.dwCpuIndex = dwCpuIndex;
            S_DemoThreadParam.dwBusCycleTimeUsec = dwBusCycleTimeUsec;
            S_pvtJobThread =
                 (EC_T_PVOID)OsCreateThread("tEcJobTask",tEcJobTask,0x62,0x4000,&S_DemoThreadParam);
            CEcTimer::Start((CEcTimer *)&pNotification,2000);
            while (iVar3 = CEcTimer::IsElapsed((CEcTimer *)&pNotification),
                  iVar3 == 0 && S_DemoThreadParam.bJobThreadRunning == 0) {
              LinuxSleep(10);
            }
            if (S_DemoThreadParam.bJobThreadRunning == 0) {
              bRes = -0x67eefff0;
              CAtEmLogging::LogError(S_poLog,"Timeout starting JobTask");
            }
            else {
              CEcTimer::Stop((CEcTimer *)&pNotification);
              EVar4 = ecatConfigureMaster(eCnfType,pbyCnfData,dwCnfDataLen);
              pCVar1 = S_poLog;
              if (EVar4 == 0) {
                if (pbyCnfData != (EC_T_PBYTE)0x0) {
                  memset((void *)((long)&oDcmConfig.u + 0x7c),0,0x30);
                  oDcmConfig._132_4_ = 12000;
                  oDcConfigure.dwClntId = 0xd;
                  oDcConfigure.dwTimeout = 0x5dc;
                  if (eDcmMode == eDcmMode_MasterRefClock) {
                    oDcConfigure.dwSettleTime = 1;
                  }
                  else if (dwBusCycleTimeUsec < 1000) {
                    oDcConfigure.dwSettleTime = 6;
                  }
                  else {
                    oDcConfigure.dwSettleTime = 0xc;
                  }
                  oDcConfigure.dwDevLimit = 10000;
                  oDcConfigure.dwBurstBulk = (EC_T_DWORD)(eDcmMode != eDcmMode_Dcx);
                  EVar4 = ecatDcConfigure((_EC_T_DC_CONFIGURE *)((long)&oDcmConfig.u + 0x7c));
                  if (EVar4 != 0) {
                    CAtEmLogging::LogError
                              (S_poLog,"Cannot configure DC! (Result = 0x%x)",(ulong)EVar4);
                    bRes = EVar4;
                    goto LAB_00147c40;
                  }
                  oRegisterResults.pbyPDOut._4_4_ = 0;
                  EVar5 = CEmNotification::Verbose(local_2b8);
                  if (2 < EVar5) {
                    oRegisterResults.pbyPDOut._4_4_ = 1;
                  }
                  if ((bDcmCtlOff != 0) && (nVerbose != 0)) {
                    CAtEmLogging::LogMsg(S_poLog,"DCM control loop disabled for diagnosis!\n");
                  }
                  oDcmConfig.u._100_8_ = 0;
                  oDcmConfig.u._108_8_ = 0;
                  oDcmConfig.u._84_8_ = 0;
                  oDcmConfig.u._92_8_ = 0;
                  oDcmConfig.u._68_8_ = 0;
                  oDcmConfig.u._76_8_ = 0;
                  oDcmConfig.u.Dcx.dwInSyncLimit = 0;
                  oDcmConfig.u.Dcx.dwInSyncSettleTime._0_2_ = 0;
                  oDcmConfig.u.Dcx.dwInSyncSettleTime._2_2_ = 0;
                  oDcmConfig.u.Dcx.bCtlOff._0_2_ = 0;
                  oDcmConfig.u._62_6_ = 0;
                  oDcmConfig.u._36_8_ = 0;
                  oDcmConfig.u._44_8_ = 0;
                  oDcmConfig.u._20_8_ = 0;
                  oDcmConfig.u._28_8_ = 0;
                  oDcmConfig.u._4_8_ = 0;
                  oDcmConfig.u._12_8_ = 0;
                  stack0xfffffffffffffda8 = 0;
                  oDcmConfig._0_8_ = 0;
                  oDcmConfig.u._116_8_ = 0;
                  switch(eDcmMode) {
                  case eDcmMode_Off:
                    stack0xfffffffffffffda8 = 0;
                    break;
                  case eDcmMode_BusShift:
                    stack0xfffffffffffffda8 = CONCAT44(iVar2,1);
                    oDcmConfig.u.BusShift.bLogEnabled = 0;
                    oDcmConfig.u.MasterRefClock.dwInSyncSettleTime = (dwBusCycleTimeUsec * 1000) / 5
                    ;
                    oDcmConfig.u._4_8_ = (ulong)oRegisterResults.pbyPDOut._4_4_ << 0x20;
                    oDcmConfig.u.BusShift.dwInSyncSettleTime = 0;
                    oDcmConfig.u.BusShift.dwInSyncLimit = bDcmCtlOff;
                    break;
                  case eDcmMode_MasterShift:
                    stack0xfffffffffffffda8 = CONCAT44(iVar2,2);
                    oDcmConfig.u.BusShift.bLogEnabled = 0;
                    oDcmConfig.u.MasterRefClock.dwInSyncSettleTime = (dwBusCycleTimeUsec * 1000) / 5
                    ;
                    oDcmConfig.u._4_8_ = (ulong)oRegisterResults.pbyPDOut._4_4_ << 0x20;
                    oDcmConfig.u.BusShift.dwInSyncSettleTime = 0;
                    oDcmConfig.u.BusShift.dwInSyncLimit = bDcmCtlOff;
                    break;
                  default:
                    bRes = -0x67eeffff;
                    CAtEmLogging::LogError(S_poLog,"DCM mode is not supported!");
                    goto LAB_00147c40;
                  case eDcmMode_MasterRefClock:
                    stack0xfffffffffffffda8 = CONCAT44(iVar2,4);
                    oDcmConfig.u.BusShift.nCtlSetVal = 0;
                    oDcmConfig.eMode = oRegisterResults.pbyPDOut._4_4_;
                    break;
                  case eDcmMode_Dcx:
                    stack0xfffffffffffffda8 = CONCAT44(iVar2,5);
                    oDcmConfig.u.BusShift.bLogEnabled = 0;
                    oDcmConfig.u.MasterRefClock.dwInSyncSettleTime = (dwBusCycleTimeUsec * 1000) / 5
                    ;
                    oDcmConfig.u._4_8_ = (ulong)oRegisterResults.pbyPDOut._4_4_ << 0x20;
                    oDcmConfig.u.BusShift.dwInSyncSettleTime = iVar2;
                    oDcmConfig.u.BusShift.dwInSyncLimit = bDcmCtlOff;
                    oDcmConfig.u.Dcx.bLogEnabled = 0;
                    oDcmConfig.u.adwReserved[0xb] = (dwBusCycleTimeUsec * 1000) / 0x32;
                    oDcmConfig.u._36_8_ = (ulong)oRegisterResults.pbyPDOut._4_4_ << 0x20;
                    oDcmConfig.u.Dcx.dwInSyncLimit = bDcmCtlOff;
                    oDcmConfig.u.Dcx.dwInSyncSettleTime._2_2_ = 1000;
                  }
                  oDcmConfig.u.Dcx.bCtlOff._0_2_ = 0;
                  oDcmConfig.u.Dcx.dwInSyncSettleTime._0_2_ = 0;
                  EVar4 = ecatDcmConfigure((_EC_T_DCM_CONFIG *)&oRegisterResults.dwPDOutSize,0);
                  pCVar1 = S_poLog;
                  if (EVar4 == 0x9811001c) {
                    CAtEmLogging::LogError(S_poLog,"Cannot configure DCM mode!");
                    CAtEmLogging::LogError
                              (S_poLog,
                               "Start with -dcmmode off to run the DC demo without DCM, or prepare the ENI file to support the requested DCM mode"
                              );
                    CAtEmLogging::LogError
                              (S_poLog,
                               "In ET9000 for example, select under Advanced settings\\Distributed clocks DC in use and Slave Mode"
                              );
                    CAtEmLogging::LogError(S_poLog,"to support BusShift and MasterRefClock modes.");
                    CAtEmLogging::LogError
                              (S_poLog,"Please refer to the class A manual for further information")
                    ;
                    bRes = EVar4;
                    goto LAB_00147c40;
                  }
                  if (EVar4 != 0) {
                    uVar10 = ecatGetText(EVar4);
                    CAtEmLogging::LogError
                              (pCVar1,"Cannot configure DCM mode! %s (Result = 0x%x)",uVar10,
                               (ulong)EVar4);
                    bRes = EVar4;
                    goto LAB_00147c40;
                  }
                }
                memset(auStack_278,0,0x1c);
                EVar4 = ecatRegisterClient(ecatNotifyCallback,local_2b8,
                                           (EC_T_REGISTERRESULTS *)auStack_278);
                if (EVar4 == 0) {
                  S_dwClntId = _auStack_278;
                  CEmNotification::SetClientID(local_2b8,_auStack_278);
                  if (1 < nVerbose) {
                    EVar4 = ecatScanBus(5000);
                    pCVar1 = S_poLog;
                    if (((EVar4 == 0x9811001e) || (EVar4 == 0x9811017b)) || (EVar4 == 0)) {
                      PrintSlaveInfos(0,poLog);
                    }
                    else {
                      uVar10 = ecatGetText(EVar4);
                      CAtEmLogging::LogError
                                (pCVar1,"Cannot scan bus: %s (0x%lx)",uVar10,(ulong)EVar4);
                    }
                  }
                  if (0 < nVerbose) {
                    EVar4 = ecatGetSrcMacAddress((ETHERNET_ADDRESS *)((long)&nDiffCur + 2));
                    if (EVar4 != 0) {
                      CAtEmLogging::LogError
                                (S_poLog,"Cannot get MAC address! (Result = 0x%x)",(ulong)EVar4);
                    }
                    CAtEmLogging::LogMsg
                              (S_poLog,
                               "EtherCAT network adapter MAC: %02X-%02X-%02X-%02X-%02X-%02X\n",
                               (ulong)nDiffCur._2_1_,(ulong)nDiffCur._3_1_,(ulong)(byte)dwDcmStatus,
                               (ulong)dwDcmStatus._1_1_,(uint)dwDcmStatus._2_1_,
                               (uint)dwDcmStatus._3_1_);
                  }
                  if (nVerbose != 0) {
                    CAtEmLogging::LogMsg(S_poLog,"=====================");
                    CAtEmLogging::LogMsg(S_poLog,"Start EtherCAT Master");
                    CAtEmLogging::LogMsg(S_poLog,"=====================");
                  }
                  EVar4 = ecatSetMasterState(15000,eEcatState_INIT);
                  CEmNotification::ProcessNotificationJobs(local_2b8);
                  pCVar1 = S_poLog;
                  if (EVar4 == 0) {
                    EVar4 = myAppPrepare(poLog,nVerbose);
                    if (EVar4 == 0) {
                      EVar4 = ecatSetMasterState(15000,eEcatState_PREOP);
                      CEmNotification::ProcessNotificationJobs(local_2b8);
                      pCVar1 = S_poLog;
                      if (EVar4 == 0) {
                        if (pbyCnfData == (EC_T_PBYTE)0x0) {
                          if (nVerbose != 0) {
                            CAtEmLogging::LogMsg
                                      (S_poLog,
                                       "No ENI file provided. EC-Master started with generated ENI file."
                                      );
                          }
                        }
                        else {
                          EVar4 = myAppSetup(poLog,nVerbose,S_dwClntId);
                          if (EVar4 != 0) {
                            CAtEmLogging::LogError
                                      (S_poLog,"myAppSetup failed, error code: 0x%x",(ulong)EVar4);
                            bRes = EVar4;
                            goto LAB_00147c40;
                          }
                          local_34 = ecatSetMasterState(15000,eEcatState_SAFEOP);
                          CEmNotification::ProcessNotificationJobs(local_2b8);
                          pCVar1 = S_poLog;
                          if (local_34 != 0) {
                            uVar10 = ecatGetText(local_34);
                            CAtEmLogging::LogError
                                      (pCVar1,
                                       "Cannot start set master state to SAFEOP (Result = %s (0x%lx))"
                                       ,uVar10,(ulong)local_34);
                            if (eDcmMode != eDcmMode_Off) {
                              nDiffAvg = 0;
                              nDiffMax = 0;
                              dwDcmStatus_1 = 0;
                              nDiffCur_1 = 0;
                              local_34 = ecatDcmGetStatus((EC_T_DWORD *)&nDiffAvg,&nDiffMax,
                                                          (EC_T_INT *)&dwDcmStatus_1,&nDiffCur_1);
                              pCVar1 = S_poLog;
                              if (local_34 == 0) {
                                if (nDiffAvg != 0) {
                                  uVar10 = ecatGetText(nDiffAvg);
                                  CAtEmLogging::LogError
                                            (pCVar1,"DCM Status: %s (0x%08X)\n",uVar10,
                                             (ulong)(uint)nDiffAvg);
                                }
                              }
                              else {
                                uVar10 = ecatGetText(local_34);
                                CAtEmLogging::LogError
                                          (pCVar1,"Cannot get DCM status! %s (0x%08X)\n",uVar10,
                                           (ulong)local_34);
                              }
                            }
                            bRes = local_34;
                            goto LAB_00147c40;
                          }
                          EVar4 = ecatSetMasterState(15000,eEcatState_OP);
                          CEmNotification::ProcessNotificationJobs(local_2b8);
                          pCVar1 = S_poLog;
                          if (EVar4 != 0) {
                            uVar10 = ecatGetText(EVar4);
                            CAtEmLogging::LogError
                                      (pCVar1,
                                       "Cannot start set master state to OP (Result = %s (0x%lx))",
                                       uVar10,(ulong)EVar4);
                            bRes = EVar4;
                            goto LAB_00147c40;
                          }
                        }
                        if (S_bEnaPerfJobs != 0) {
                          CAtEmLogging::LogMsg(S_poLog,"");
                          pCVar1 = S_poLog;
                          EVar6 = ecatGetMasterState();
                          pEVar9 = ecatStateToStr(EVar6);
                          CAtEmLogging::LogMsg
                                    (pCVar1,"Job times during startup <INIT> to <%s>:",pEVar9);
                          ecatPerfMeasShow(&S_TscMeasDesc,0xffffffff,S_aszMeasInfo);
                          CAtEmLogging::LogMsg(S_poLog,"");
                          ecatPerfMeasReset(&S_TscMeasDesc,0xffffffff);
                        }
                        if (dwDuration != 0) {
                          CEcTimer::Start((CEcTimer *)&pNotification,dwDuration);
                        }
                        while( true ) {
                          bVar11 = false;
                          if (bRun != 0) {
                            EVar7 = CEcTimer::IsStarted((CEcTimer *)&pNotification);
                            bVar11 = true;
                            if (EVar7 != 0) {
                              iVar2 = CEcTimer::IsElapsed((CEcTimer *)&pNotification);
                              bVar11 = iVar2 == 0;
                            }
                          }
                          if (!bVar11) break;
                          if (1 < nVerbose) {
                            ecatPerfMeasShow(&S_TscMeasDesc,0xffffffff,S_aszMeasInfo);
                          }
                          bRun = 1;
                          myAppDiagnosis(poLog,nVerbose);
                          if ((pbyCnfData != (EC_T_PBYTE)0x0) && (eDcmMode != eDcmMode_Off)) {
                            nDiffAvg_1 = 0;
                            nDiffMax_1 = 0;
                            bLogDcmStatus = 0;
                            bResetDcmStatus = 0;
                            nTimeStampDiff._4_4_ = 0;
                            nTimeStampDiff._0_4_ = CpuSet;
                            EVar7 = CEcTimer::IsStarted((CEcTimer *)&nDcmCtlSetVal);
                            if (((EVar7 == 0) ||
                                (iVar2 = CEcTimer::IsElapsed((CEcTimer *)&nDcmCtlSetVal), iVar2 != 0
                                )) && (CEcTimer::Start((CEcTimer *)&nDcmCtlSetVal,5000),
                                      2 < nVerbose)) {
                              nTimeStampDiff._4_4_ = 1;
                            }
                            EVar4 = ecatDcmGetStatus((EC_T_DWORD *)&nDiffAvg_1,&nDiffMax_1,
                                                     &bLogDcmStatus,&bResetDcmStatus);
                            pCVar1 = S_poLog;
                            if (EVar4 == 0) {
                              if (CpuSet != 0) {
                                EVar6 = ecatGetMasterState();
                                pEVar9 = ecatStateToStr(EVar6);
                                CAtEmLogging::LogMsg
                                          (pCVar1,"DCM during startup (<INIT> to <%s>)",pEVar9);
                              }
                              pCVar1 = S_poLog;
                              if (((nDiffAvg_1 != -0x67eefff9) && (nDiffAvg_1 != -0x67eefff8)) &&
                                 (nDiffAvg_1 != 0)) {
                                uVar10 = ecatGetText(nDiffAvg_1);
                                CAtEmLogging::LogMsg
                                          (pCVar1,"DCM Status: %s (0x%08X)\n",uVar10,
                                           (ulong)(uint)nDiffAvg_1);
                              }
                              if (nTimeStampDiff._4_4_ != 0) {
                                CAtEmLogging::LogMsg
                                          (S_poLog,"DCM Diff(ns): Cur=%7d, Avg=%7d, Max=%7d",
                                           (ulong)(uint)nDiffMax_1,(ulong)(uint)bLogDcmStatus,
                                           (ulong)(uint)bResetDcmStatus);
                              }
                            }
                            else {
                              EVar6 = ecatGetMasterState();
                              if ((EVar6 == eEcatState_OP) ||
                                 (EVar6 = ecatGetMasterState(), EVar6 == eEcatState_SAFEOP)) {
                                pCVar1 = S_poLog;
                                uVar10 = ecatGetText(EVar4);
                                CAtEmLogging::LogError
                                          (pCVar1,"Cannot get DCM status! %s (0x%08X)\n",uVar10,
                                           (ulong)EVar4);
                              }
                              nTimeStampDiff._0_4_ = 0;
                            }
                            if (eDcmMode == eDcmMode_Dcx) {
                              local_2b0 = 0;
                              EVar4 = ecatDcxGetStatus((EC_T_DWORD *)&nDiffAvg_1,&nDiffMax_1,
                                                       &bLogDcmStatus,&bResetDcmStatus,&local_2b0);
                              pCVar1 = S_poLog;
                              if (EVar4 == 0) {
                                if (CpuSet != 0) {
                                  EVar6 = ecatGetMasterState();
                                  pEVar9 = ecatStateToStr(EVar6);
                                  CAtEmLogging::LogMsg
                                            (pCVar1,"DCX during startup (<INIT> to <%s>)",pEVar9);
                                }
                                pCVar1 = S_poLog;
                                if (((nDiffAvg_1 != -0x67eefff9) && (nDiffAvg_1 != -0x67eefff8)) &&
                                   (nDiffAvg_1 != 0)) {
                                  uVar10 = ecatGetText(nDiffAvg_1);
                                  CAtEmLogging::LogMsg
                                            (pCVar1,"DCX Status: %s (0x%08X)\n",uVar10,
                                             (ulong)(uint)nDiffAvg_1);
                                }
                                if (nTimeStampDiff._4_4_ != 0) {
                                  CAtEmLogging::LogMsg
                                            (S_poLog,
                                             "DCX Diff(ns): Cur=%7d, Avg=%7d, Max=%7d, TimeStamp=%7d"
                                             ,(ulong)(uint)nDiffMax_1,(ulong)(uint)bLogDcmStatus,
                                             (ulong)(uint)bResetDcmStatus,local_2b0);
                                }
                              }
                              else {
                                EVar6 = ecatGetMasterState();
                                if ((EVar6 == eEcatState_OP) ||
                                   (EVar6 = ecatGetMasterState(), EVar6 == eEcatState_SAFEOP)) {
                                  pCVar1 = S_poLog;
                                  uVar10 = ecatGetText(EVar4);
                                  CAtEmLogging::LogError
                                            (pCVar1,"Cannot get DCX status! %s (0x%08X)\n",uVar10,
                                             (ulong)EVar4);
                                }
                                nTimeStampDiff._0_4_ = 0;
                              }
                            }
                            if ((int)nTimeStampDiff != 0) {
                              ecatDcmResetStatus();
                              CpuSet = 0;
                            }
                          }
                          CEmNotification::ProcessNotificationJobs(local_2b8);
                          LinuxSleep(5);
                        }
                        if (S_bEnaPerfJobs != 0) {
                          CAtEmLogging::LogMsg(S_poLog,"");
                          CAtEmLogging::LogMsg(S_poLog,"Job times before shutdown");
                          ecatPerfMeasShow(&S_TscMeasDesc,0xffffffff,S_aszMeasInfo);
                        }
                      }
                      else {
                        uVar10 = ecatGetText(EVar4);
                        CAtEmLogging::LogError
                                  (pCVar1,
                                   "Cannot start set master state to PREOP (Result = %s (0x%lx))",
                                   uVar10,(ulong)EVar4);
                        bRes = EVar4;
                      }
                    }
                    else {
                      CAtEmLogging::LogError
                                (S_poLog,"myAppPrepare failed, error code: 0x%x",(ulong)EVar4);
                      bRes = EVar4;
                    }
                  }
                  else {
                    uVar10 = ecatGetText(EVar4);
                    CAtEmLogging::LogError
                              (pCVar1,"Cannot start set master state to INIT (Result = %s (0x%lx))",
                               uVar10,(ulong)EVar4);
                    bRes = EVar4;
                  }
                }
                else {
                  CAtEmLogging::LogError
                            (S_poLog,"Cannot register client! (Result = 0x%x)",(ulong)EVar4);
                  bRes = EVar4;
                }
              }
              else {
                uVar10 = ecatGetText(EVar4);
                CAtEmLogging::LogError
                          (pCVar1,"Cannot configure EtherCAT-Master! %s (Result = 0x%x)",uVar10,
                           (ulong)EVar4);
                bRes = EVar4;
              }
            }
          }
          else {
            uVar10 = ecatGetText(EVar4);
            CAtEmLogging::LogError
                      (pCVar1,"Cannot initialize EtherCAT-Master! (Result = %s 0x%x)",uVar10,
                       (ulong)EVar4);
            bRes = EVar4;
          }
        }
        else {
          CAtEmLogging::LogError(S_poLog,"myAppInit failed, error code: 0x%x",(ulong)EVar4);
          bRes = EVar4;
        }
      }
    }
  }
  else {
    bRes = -0x67eefff5;
    CAtEmLogging::LogError
              (S_poLog,
               "Error: Link layer in \'interrupt\' mode is not supported by EcMasterDemoDc. Please select \'polling\' mode."
              );
  }
LAB_00147c40:
  if (nVerbose != 0) {
    CAtEmLogging::LogMsg(S_poLog,"========================");
    CAtEmLogging::LogMsg(S_poLog,"Shutdown EtherCAT Master");
    CAtEmLogging::LogMsg(S_poLog,"========================");
  }
  local_34 = ecatSetMasterState(15000,eEcatState_INIT);
  pCVar1 = S_poLog;
  if (local_34 != 0) {
    uVar10 = ecatGetText(local_34);
    CAtEmLogging::LogError(pCVar1,"Cannot stop EtherCAT-Master! %s (0x%lx)",uVar10,(ulong)local_34);
  }
  if (S_dwClntId != 0) {
    local_34 = ecatUnregisterClient(S_dwClntId);
    pCVar1 = S_poLog;
    if (local_34 != 0) {
      uVar10 = ecatGetText(local_34);
      CAtEmLogging::LogError(pCVar1,"Cannot unregister client! %s (0x%lx)",uVar10,(ulong)local_34);
    }
    S_dwClntId = 0;
  }
  S_DemoThreadParam.bJobThreadShutdown = 1;
  CEcTimer::Start((CEcTimer *)&pNotification,2000);
  while( true ) {
    bVar11 = false;
    if (S_DemoThreadParam.bJobThreadRunning != 0) {
      iVar2 = CEcTimer::IsElapsed((CEcTimer *)&pNotification);
      bVar11 = iVar2 == 0;
    }
    if (!bVar11) break;
    LinuxSleep(10);
  }
  if (S_pvtJobThread != (EC_T_PVOID)0x0) {
    OsDeleteThreadHandle(S_pvtJobThread);
    S_pvtJobThread = (EC_T_PVOID)0x0;
  }
  if (S_bRasSrvStarted != 0) {
    CAtEmLogging::LogMsg(S_poLog,"Stop Remote Api Server\n");
    iVar2 = emRasSrvStop(S_pvRemoteApiSrvH,2000);
    if (iVar2 != 0) {
      CAtEmLogging::LogError(S_poLog,"Remote API Server shutdown failed\n");
    }
  }
  CAtEmLogging::LogMsg(S_poLog,"ecatDeinitMaster() should be called here.");
  CAtEmLogging::LogMsg
            (S_poLog,"But this would provoke a \' double free or corruption (out):\' error.");
  pCVar1 = S_poLog;
  if (local_34 != 0) {
    uVar10 = ecatGetText(local_34);
    CAtEmLogging::LogError
              (pCVar1,"Cannot de-initialize EtherCAT-Master! %s (0x%lx)",uVar10,(ulong)local_34);
  }
  if (S_bEnaPerfJobs != 0) {
    ecatPerfMeasDeinit(&S_TscMeasDesc);
  }
  if ((local_60 != (CEmNotification *)0x0) && (local_60 != (CEmNotification *)0x0)) {
    operator_delete(local_60);
  }
  return bRes;
}

Assistant:

EC_T_DWORD EtherCATStack(
    CAtEmLogging*       poLog
   ,EC_T_CNF_TYPE       eCnfType                /* [in] Enum type of configuration data provided */
   ,EC_T_PBYTE          pbyCnfData              /* [in] Configuration data */                      
   ,EC_T_DWORD          dwCnfDataLen            /* [in] Length of configuration data in byte */    
   ,EC_T_DWORD          dwBusCycleTimeUsec      /* [in]  bus cycle time in usec */
   ,EC_T_INT            nVerbose                /* [in]  verbosity level */
   ,EC_T_DWORD          dwDuration              /* [in]  test duration in msec (0 = forever) */
   ,EC_T_LINK_PARMS*    poLinkParms             /* [in]  pointer to link parameter */
   ,EC_T_VOID*          pvTimingEvent           /* [in]  Timing event handle */
   ,EC_T_DWORD          dwCpuIndex              /* [in]  SMP only: CPU index */
   ,EC_T_BOOL           bEnaPerfJobs            /* [in]  Performance measurement */
#ifdef ATEMRAS_SERVER 
   ,EC_T_WORD           wServerPort             /* [in]   Remote API Server Port */
#endif
   ,EC_T_LINK_PARMS*    poLinkParmsRed          /* [in]  Redundancy Link Layer Parameter */
   ,EC_T_OS_PARMS*      poOsParms               /* [in]  pointer to OS parameters  */
   ,EC_T_DCM_MODE       eDcmMode                /* [in]  DCM mode */
   ,EC_T_BOOL           bDcmCtlOff              /* [in]  Disables / Enables the control loop for diagnosis */
   ,void (*callbackFctPtr)(EC_T_BYTE*, EC_T_BYTE*)
   ,char*				licenseKey
)
{
	
	callbackFct = callbackFctPtr;
    EC_T_DWORD       dwRetVal = EC_E_NOERROR;
    EC_T_DWORD       dwRes    = EC_E_NOERROR;
    EC_T_BOOL        bRes     = EC_FALSE;
    CEcTimer         oTimeout;
    CEmNotification* pNotification = EC_NULL;
    CEcTimer         oDcmStatusTimer;
    EC_T_BOOL        bFirstDcmStatus = EC_TRUE;
    EC_T_INT         nDcmCtlSetVal = ((dwBusCycleTimeUsec*2)/3)*1000; /* set value in nanosec, 66% of the bus cycle */

    /* store parameters */
    S_poLog = poLog;
    S_bEnaPerfJobs = bEnaPerfJobs;
    S_DemoThreadParam.pvTimingEvent = pvTimingEvent;

	LogMsg("nVerbose: %d\n", nVerbose);
    /* check if interrupt mode is selected */
    if (poLinkParms->eLinkMode != EcLinkMode_POLLING)
    {
        dwRetVal = EC_E_INVALIDPARM;
        LogError("Error: Link layer in 'interrupt' mode is not supported by EcMasterDemoDc. Please select 'polling' mode.");
        goto Exit;
    }
    /* set thread affinity */
    {
        EC_T_CPUSET CpuSet;

        EC_CPUSET_ZERO(CpuSet);
        EC_CPUSET_SET(CpuSet, dwCpuIndex);
        bRes = OsSetThreadAffinity(EC_NULL, CpuSet);
        if (!bRes)
        {
            dwRetVal = EC_E_INVALIDPARM;
            LogError("Error: Set thread affinitiy, invalid CPU index %d\n", dwCpuIndex);
            goto Exit;
        }
    }
    /* create notification context */
    pNotification = EC_NEW(CEmNotification(INSTANCE_MASTER_DEFAULT, poLog));
    if (EC_NULL == pNotification)
    {
        dwRetVal = EC_E_NOMEMORY;
        goto Exit;
    }
    pNotification->Verbose(nVerbose);

    if (S_bEnaPerfJobs)
    {
        PERF_MEASURE_JOBS_INIT(EC_NULL);
    }
    
    /* Demo code: Remove/change this in your application: Initialize application */
    /*****************************************************************************/
    dwRes = myAppInit(poLog, nVerbose);
    if (EC_E_NOERROR != dwRes)
    {
        LogError( (EC_T_CHAR*)"myAppInit failed, error code: 0x%x", dwRes );
        dwRetVal = dwRes;
        goto Exit;
    }
#ifdef ATEMRAS_SERVER
    /*******************************/
    /* Start RAS server if enabled */
    /*******************************/
    if (0xFFFF != wServerPort)
    {
        ATEMRAS_T_SRVPARMS oRemoteApiConfig;

        OsMemset(&oRemoteApiConfig, 0, sizeof(ATEMRAS_T_SRVPARMS));
        oRemoteApiConfig.oAddr.dwAddr       = 0;                    /* INADDR_ANY */
        oRemoteApiConfig.wPort              = wServerPort;
        oRemoteApiConfig.dwCycleTime        = REMOTE_CYCLE_TIME;    /* 2 msec */
        oRemoteApiConfig.dwWDTOLimit        = (REMOTE_WD_TO_LIMIT/REMOTE_CYCLE_TIME); /* WD Timeout after 10secs */
        oRemoteApiConfig.dwReConTOLimit     = 6000;                 /* Reconnect Timeout after 6000*2msec + 10secs */
        oRemoteApiConfig.dwMasterPrio       = MAIN_THREAD_PRIO;
        oRemoteApiConfig.dwClientPrio       = MAIN_THREAD_PRIO;
        oRemoteApiConfig.pvNotifCtxt        = pNotification;        /* Notification context */
        oRemoteApiConfig.pfNotification     = RasNotifyWrapper;     /* Notification function for emras Layer */
        oRemoteApiConfig.dwConcNotifyAmount = 100;                  /* for the first pre-allocate 100 Notification spaces */
        oRemoteApiConfig.dwMbxNotifyAmount  = 50;                   /* for the first pre-allocate 50 Notification spaces */
        oRemoteApiConfig.dwMbxUsrNotifySize = 3000;                 /* 3K user space for Mailbox Notifications */
        oRemoteApiConfig.dwCycErrInterval   = 500;                  /* span between to consecutive cyclic notifications of same type */
        if (0 != nVerbose) LogMsg("Start Remote API Server now\n");
        dwRes = emRasSrvStart(oRemoteApiConfig, &S_pvRemoteApiSrvH);
        if (EC_E_NOERROR != dwRes)
        {
            LogError("ERROR: Cannot spawn Remote API Server\n");
        }
        S_bRasSrvStarted = EC_TRUE;
    }
#endif
    /******************************/
    /* Initialize EtherCAT master */
    /******************************/
    if (0 != nVerbose) LogMsg( "==========================" );
    if (0 != nVerbose) LogMsg( "Initialize EtherCAT Master" );
    if (0 != nVerbose) LogMsg( "==========================" );
    {
        EC_T_INIT_MASTER_PARMS oInitParms;

        OsMemset(&oInitParms, 0, sizeof(EC_T_INIT_MASTER_PARMS));
        oInitParms.dwSignature                   = ATECAT_SIGNATURE;
        oInitParms.dwSize                        = sizeof(EC_T_INIT_MASTER_PARMS);
        oInitParms.pLinkParms                    = poLinkParms;
        oInitParms.pLinkParmsRed                 = poLinkParmsRed;
        oInitParms.dwBusCycleTimeUsec            = dwBusCycleTimeUsec;
        oInitParms.dwMaxBusSlaves                = MASTER_CFG_ECAT_MAX_BUS_SLAVES;
        oInitParms.dwMaxQueuedEthFrames          = MASTER_CFG_MAX_QUEUED_ETH_FRAMES;
        oInitParms.dwMaxSlaveCmdPerFrame         = MASTER_CFG_MAX_SLAVECMD_PER_FRAME;
        if (dwBusCycleTimeUsec < 1000)
        {
            oInitParms.dwMaxSentQueuedFramesPerCycle = 1;
        }
        else
        {
            oInitParms.dwMaxSentQueuedFramesPerCycle = MASTER_CFG_MAX_SENT_QUFRM_PER_CYC;
        }
        oInitParms.dwEcatCmdMaxRetries           = MASTER_CFG_ECAT_CMD_MAX_RETRIES;
        oInitParms.dwEoETimeout                  = MASTER_CFG_EOE_TIMEOUT;
        oInitParms.dwFoEBusyTimeout              = MASTER_CFG_FOE_BUSY_TIMEOUT;
        oInitParms.dwLogLevel                    = nVerbose;
        oInitParms.pfLogMsgCallBack              = CAtEmLogging::OsDbgMsgHookWrapper;
        oInitParms.pOsParms                      = poOsParms;
        dwRes = ecatInitMaster(&oInitParms);        
        if (EC_E_NOERROR != dwRes)
        {
            dwRetVal = dwRes;
            LogError("Cannot initialize EtherCAT-Master! (Result = %s 0x%x)", ecatGetText(dwRes), dwRes);
            goto Exit;
        }
        
        if (strlen(licenseKey) > 1) {
			LogMsg("LicenseKey: %s",licenseKey);
			dwRes = ecatSetLicenseKey(licenseKey);
			if (EC_E_NOERROR == dwRes) LogMsg("ACTIVATION SUCCESSFULL");
			else 	 					LogError("ACTIVATION FAILED (Result = %s 0x%x)", ecatGetText(dwRes), dwRes);
		}
    }
    
    /* Create cyclic task to trigger master jobs */
    /*********************************************/
    S_DemoThreadParam.bJobThreadRunning  = EC_FALSE;
    S_DemoThreadParam.bJobThreadShutdown = EC_FALSE;
    S_DemoThreadParam.pLogInst           = S_poLog;
    S_DemoThreadParam.pNotInst           = pNotification;
    S_DemoThreadParam.dwCpuIndex         = dwCpuIndex;
    S_DemoThreadParam.dwBusCycleTimeUsec = dwBusCycleTimeUsec;
    S_pvtJobThread = OsCreateThread((EC_T_CHAR*)"tEcJobTask", tEcJobTask,
#if !(defined EC_VERSION_GO32)
                                    JOBS_THREAD_PRIO,
#else
                                    dwBusCycleTimeUsec,
#endif
                                    JOBS_THREAD_STACKSIZE, (EC_T_VOID*)&S_DemoThreadParam);
#ifdef RTAI
    OsMakeThreadPeriodic(S_pvtJobThread, dwBusCycleTimeUsec);
#endif
    /* wait until thread is running */
    oTimeout.Start(2000);
    while (!oTimeout.IsElapsed() && !S_DemoThreadParam.bJobThreadRunning)
    {
        OsSleep(10);
    }
    if (!S_DemoThreadParam.bJobThreadRunning)
    {
        dwRetVal = EC_E_TIMEOUT;
        LogError("Timeout starting JobTask");
        goto Exit;
    }
    oTimeout.Stop();

    /* Configure master */
    dwRes = ecatConfigureMaster(eCnfType, pbyCnfData, dwCnfDataLen);
    if (EC_E_NOERROR != dwRes)
    {
        dwRetVal = dwRes;
        LogError("Cannot configure EtherCAT-Master! %s (Result = 0x%x)", ecatGetText(dwRes), dwRes);
        goto Exit;
    }
    /* configure DC/DCM if master is started with ENI */
    if (pbyCnfData != EC_NULL)
    {
        /* configure DC */
        {
            EC_T_DC_CONFIGURE oDcConfigure;

            OsMemset(&oDcConfigure, 0, sizeof(EC_T_DC_CONFIGURE));
            oDcConfigure.dwTimeout          = ETHERCAT_DC_TIMEOUT;
            oDcConfigure.dwDevLimit         = ETHERCAT_DC_DEV_LIMIT;
            oDcConfigure.dwSettleTime       = ETHERCAT_DC_SETTLE_TIME;
            if (eDcmMode_MasterRefClock == eDcmMode)
            {
                oDcConfigure.dwTotalBurstLength = 10000; 
                oDcConfigure.dwBurstBulk        = 1;
            }
            else
            {
                oDcConfigure.dwTotalBurstLength = ETHERCAT_DC_ARMW_BURSTCYCLES; 
                if (dwBusCycleTimeUsec < 1000)
                {
                    /* if the cycle time is below 1000 usec, we have to reduce the number of frames sent within one cycle */
                    oDcConfigure.dwBurstBulk = ETHERCAT_DC_ARMW_BURSTSPP / 2;
                }
                else
                {
                    oDcConfigure.dwBurstBulk = ETHERCAT_DC_ARMW_BURSTSPP;
                }
            }
            if (eDcmMode_Dcx == eDcmMode)
            {
                oDcConfigure.bAcycDistributionDisabled = EC_FALSE; /* Enable acyclic distribution if cycle time is above 1000 usec to get DCX in sync */
            }
            else
            {
                oDcConfigure.bAcycDistributionDisabled = EC_TRUE;
            }
            dwRes = ecatDcConfigure(&oDcConfigure);
            if (dwRes != EC_E_NOERROR )
            {
                dwRetVal = dwRes;
                LogError("Cannot configure DC! (Result = 0x%x)", dwRes);
                goto Exit;
            }
        }
        /* configure DCM */
        {
            EC_T_DCM_CONFIG oDcmConfig;
            EC_T_BOOL       bLogEnabled = EC_FALSE;
#ifdef DCM_ENABLE_LOGFILE
            if (pNotification->Verbose() >= 3)
            {
                bLogEnabled = EC_TRUE;
            }
#endif
            if (bDcmCtlOff)
            {
                if (0 != nVerbose) LogMsg("DCM control loop disabled for diagnosis!\n");
            }
            OsMemset(&oDcmConfig, 0, sizeof(EC_T_DCM_CONFIG));
            switch (eDcmMode)
            {
            case eDcmMode_Off:
                oDcmConfig.eMode = eDcmMode_Off;
                break;
            case eDcmMode_BusShift:
                oDcmConfig.eMode = eDcmMode_BusShift;
                oDcmConfig.u.BusShift.nCtlSetVal    = nDcmCtlSetVal;
                oDcmConfig.u.BusShift.dwInSyncLimit = (dwBusCycleTimeUsec*1000)/5;    /* 20 % limit in nsec for InSync monitoring */
                oDcmConfig.u.BusShift.bLogEnabled = bLogEnabled;
                oDcmConfig.u.BusShift.bCtlOff = bDcmCtlOff;
                break;
             case eDcmMode_MasterShift:
                oDcmConfig.eMode = eDcmMode_MasterShift;
                oDcmConfig.u.MasterShift.nCtlSetVal    = nDcmCtlSetVal;
                oDcmConfig.u.MasterShift.dwInSyncLimit = (dwBusCycleTimeUsec*1000)/5;    /* 20 % limit in nsec for InSync monitoring */
                oDcmConfig.u.MasterShift.bLogEnabled = bLogEnabled;
                oDcmConfig.u.MasterShift.bCtlOff = bDcmCtlOff;
                break;
            case eDcmMode_MasterRefClock:
                oDcmConfig.eMode = eDcmMode_MasterRefClock;
                oDcmConfig.u.MasterRefClock.nCtlSetVal  = nDcmCtlSetVal;
                oDcmConfig.u.MasterRefClock.bLogEnabled = bLogEnabled;
                break;
            case eDcmMode_Dcx:
                oDcmConfig.eMode = eDcmMode_Dcx;
                /* Mastershift */
                oDcmConfig.u.Dcx.MasterShift.nCtlSetVal = nDcmCtlSetVal;
                oDcmConfig.u.Dcx.MasterShift.dwInSyncLimit = (dwBusCycleTimeUsec * 1000) / 5;    /* 20 % limit in nsec for InSync monitoring */
                oDcmConfig.u.Dcx.MasterShift.bLogEnabled = bLogEnabled;
                oDcmConfig.u.Dcx.MasterShift.bCtlOff = bDcmCtlOff;
                /* Dcx Busshift */
                oDcmConfig.u.Dcx.nCtlSetVal = nDcmCtlSetVal;
                oDcmConfig.u.Dcx.dwInSyncLimit = (dwBusCycleTimeUsec * 1000) / 50;   /* 2 % limit in nsec for InSync monitoring */
                oDcmConfig.u.Dcx.bLogEnabled = bLogEnabled;
                oDcmConfig.u.Dcx.bCtlOff = bDcmCtlOff;
                oDcmConfig.u.Dcx.dwExtClockTimeout = 1000;
                oDcmConfig.u.Dcx.wExtClockFixedAddr = 0; /* 0 only when clock adjustment in external mode configured by EcEngineer */
                break;
            default:
                dwRetVal = EC_E_NOTSUPPORTED;
                LogError("DCM mode is not supported!");
                goto Exit;

            }
            dwRes = ecatDcmConfigure(&oDcmConfig, 0);
            switch (dwRes)
            {
            case EC_E_NOERROR:
                break;
            case EC_E_FEATURE_DISABLED:
                LogError("Cannot configure DCM mode!");
                LogError("Start with -dcmmode off to run the DC demo without DCM, or prepare the ENI file to support the requested DCM mode");
                LogError("In ET9000 for example, select under ""Advanced settings\\Distributed clocks"" ""DC in use"" and ""Slave Mode""");
                LogError("to support BusShift and MasterRefClock modes.");
                LogError("Please refer to the class A manual for further information");
                dwRetVal = dwRes;
                goto Exit;
            default:
                LogError("Cannot configure DCM mode! %s (Result = 0x%x)", ecatGetText(dwRes), dwRes);
                dwRetVal = dwRes;
                goto Exit;
            }
        }
    }
    /* Register client */
    {
        EC_T_REGISTERRESULTS oRegisterResults;

        OsMemset(&oRegisterResults, 0, sizeof(EC_T_REGISTERRESULTS));
        dwRes = ecatRegisterClient(ecatNotifyCallback, pNotification, &oRegisterResults);
        if (EC_E_NOERROR != dwRes)
        {
            dwRetVal = dwRes;
            LogError("Cannot register client! (Result = 0x%x)", dwRes);
            goto Exit;
        }
        S_dwClntId = oRegisterResults.dwClntId;
        pNotification->SetClientID(S_dwClntId);
    }
    
    /* Print found slaves */
    if (nVerbose >= 2)
    {
        dwRes = ecatScanBus(ETHERCAT_SCANBUS_TIMEOUT);
        switch (dwRes)
        {
        case EC_E_NOERROR:
        case EC_E_BUSCONFIG_MISMATCH:
        case EC_E_LINE_CROSSED:
            PrintSlaveInfos(INSTANCE_MASTER_DEFAULT, poLog);
            break;
        default:
            LogError("Cannot scan bus: %s (0x%lx)", ecatGetText(dwRes), dwRes);
            break;
        }
    }

    /* Print MAC address */
    if (nVerbose > 0)
    {
        ETHERNET_ADDRESS oSrcMacAddress;

        dwRes = ecatGetSrcMacAddress(&oSrcMacAddress);
        if (EC_E_NOERROR != dwRes)
        {
            LogError("Cannot get MAC address! (Result = 0x%x)", dwRes);
        }
        LogMsg("EtherCAT network adapter MAC: %02X-%02X-%02X-%02X-%02X-%02X\n",
            oSrcMacAddress.b[0], oSrcMacAddress.b[1], oSrcMacAddress.b[2], oSrcMacAddress.b[3], oSrcMacAddress.b[4], oSrcMacAddress.b[5]);
    }
    
    /* Start EtherCAT bus --> set Master state to OPERATIONAL if ENI file provided */
    /*******************************************************************************/
    if (0 != nVerbose) LogMsg( "=====================" );
    if (0 != nVerbose) LogMsg( "Start EtherCAT Master" );
    if (0 != nVerbose) LogMsg( "=====================" );

    /* set master and bus state to INIT */
    dwRes = ecatSetMasterState(ETHERCAT_STATE_CHANGE_TIMEOUT, eEcatState_INIT);
    pNotification->ProcessNotificationJobs();
    if (EC_E_NOERROR != dwRes)
    {
        LogError("Cannot start set master state to INIT (Result = %s (0x%lx))", ecatGetText(dwRes), dwRes);
        dwRetVal = dwRes;
        goto Exit;
    }

    /******************************************************/
    /* Demo code: Remove/change this in your application  */
    /******************************************************/
    dwRes = myAppPrepare(poLog, nVerbose);
    if (EC_E_NOERROR != dwRes)
    {
        LogError((EC_T_CHAR*)"myAppPrepare failed, error code: 0x%x", dwRes);
        dwRetVal = dwRes;
        goto Exit;
    }
    /* set master and bus state to PREOP */
    dwRes = ecatSetMasterState(ETHERCAT_STATE_CHANGE_TIMEOUT, eEcatState_PREOP);
    pNotification->ProcessNotificationJobs();
    if (EC_E_NOERROR != dwRes)
    {
        LogError("Cannot start set master state to PREOP (Result = %s (0x%lx))", ecatGetText(dwRes), dwRes);
        dwRetVal = dwRes;
        goto Exit;
    }
    /* skip this step if demo started without ENI */
    if (pbyCnfData != EC_NULL)
    {
        /******************************************************/
        /* Demo code: Remove/change this in your application  */
        /******************************************************/
        dwRes = myAppSetup(poLog, nVerbose, S_dwClntId);
        if (EC_E_NOERROR != dwRes)
        {
            LogError((EC_T_CHAR*)"myAppSetup failed, error code: 0x%x", dwRes);
            dwRetVal = dwRes;
            goto Exit;
        }
        /* set master and bus state to SAFEOP */
        dwRes = ecatSetMasterState(ETHERCAT_STATE_CHANGE_TIMEOUT, eEcatState_SAFEOP);
        pNotification->ProcessNotificationJobs();
        if (EC_E_NOERROR != dwRes)
        {
            LogError("Cannot start set master state to SAFEOP (Result = %s (0x%lx))", ecatGetText(dwRes), dwRes);

            /* most of the time SAFEOP is not reachable due to DCM */
            if (eDcmMode_Off != eDcmMode)
            {
            EC_T_DWORD dwDcmStatus = 0;
            EC_T_INT   nDiffCur = 0, nDiffAvg = 0, nDiffMax = 0;

                dwRes = ecatDcmGetStatus(&dwDcmStatus, &nDiffCur, &nDiffAvg, &nDiffMax);
                if (dwRes == EC_E_NOERROR)
                {
                    if (dwDcmStatus != EC_E_NOERROR)
                    {
                        LogError("DCM Status: %s (0x%08X)\n", ecatGetText(dwDcmStatus), dwDcmStatus);
                    }
                }
                else
                {
                    LogError("Cannot get DCM status! %s (0x%08X)\n", ecatGetText(dwRes), dwRes);
                }
            }
            dwRetVal = dwRes;
            goto Exit;
        }
        /* set master and bus state to OP */
        dwRes = ecatSetMasterState(ETHERCAT_STATE_CHANGE_TIMEOUT, eEcatState_OP);
        pNotification->ProcessNotificationJobs();
        if (EC_E_NOERROR != dwRes)
        {
            LogError("Cannot start set master state to OP (Result = %s (0x%lx))", ecatGetText(dwRes), dwRes);
            dwRetVal = dwRes;
            goto Exit;
        }
    }
    else
    {
        if (0 != nVerbose) LogMsg("No ENI file provided. EC-Master started with generated ENI file.");
    }

    if (S_bEnaPerfJobs)
    {
        LogMsg("");
        LogMsg("Job times during startup <INIT> to <%s>:", ecatStateToStr(ecatGetMasterState()));
        PERF_MEASURE_JOBS_SHOW();       /* show job times */
        LogMsg("");
        ecatPerfMeasReset(&S_TscMeasDesc, 0xFFFFFFFF);        /* clear job times of startup phase */
    }

#if (defined DEBUG) && (defined XENOMAI)
    /* Enabling mode switch warnings for shadowed task */
    dwRes = rt_task_set_mode(0, T_WARNSW, NULL);
    if (0 != dwRes)
    {
        OsDbgMsg("EnableRealtimeEnvironment: rt_task_set_mode returned an error\n");
        OsDbgAssert(EC_FALSE);
    }
#endif

    /* run the demo */
    if (dwDuration != 0)
    {
        oTimeout.Start(dwDuration);
    }
    while (bRun && (!oTimeout.IsStarted() || !oTimeout.IsElapsed()))
    {
        if (nVerbose >= 2)
        {
            PERF_MEASURE_JOBS_SHOW();       /* show job times */
        }
        bRun = !OsTerminateAppRequest();/* check if demo shall terminate */

        /*****************************************************************************************/
        /* Demo code: Remove/change this in your application: Do some diagnosis outside job task */
        /*****************************************************************************************/
        myAppDiagnosis(poLog, nVerbose);

        /* check DCM status if master is started with ENI */
        if (pbyCnfData != EC_NULL)
        {
            if (eDcmMode_Off != eDcmMode)
            {
            EC_T_DWORD dwDcmStatus = 0;
            EC_T_INT   nDiffCur = 0, nDiffAvg = 0, nDiffMax = 0;
            EC_T_BOOL  bLogDcmStatus = EC_FALSE;
            EC_T_BOOL  bResetDcmStatus = bFirstDcmStatus;

                if (!oDcmStatusTimer.IsStarted() || oDcmStatusTimer.IsElapsed())
                {
                    oDcmStatusTimer.Start(5000);
                    if (nVerbose >= 3)
                    {
                        bLogDcmStatus = EC_TRUE;
                    }
                }
                dwRes = ecatDcmGetStatus(&dwDcmStatus, &nDiffCur, &nDiffAvg, &nDiffMax);
                if (dwRes == EC_E_NOERROR)
                {
                    if (bFirstDcmStatus)
                    {
                        LogMsg("DCM during startup (<INIT> to <%s>)", ecatStateToStr(ecatGetMasterState()));
                    }
                    if ((dwDcmStatus != EC_E_NOTREADY) && (dwDcmStatus != EC_E_BUSY) && (dwDcmStatus != EC_E_NOERROR))
                    {
                        LogMsg("DCM Status: %s (0x%08X)\n", ecatGetText(dwDcmStatus), dwDcmStatus);
                    }
                    if (bLogDcmStatus)
                    {
                        LogMsg("DCM Diff(ns): Cur=%7d, Avg=%7d, Max=%7d", nDiffCur, nDiffAvg, nDiffMax);
                    }
                }
                else
                {
                    if ((eEcatState_OP == ecatGetMasterState()) || (eEcatState_SAFEOP == ecatGetMasterState()))
                    {
                        LogError("Cannot get DCM status! %s (0x%08X)\n", ecatGetText(dwRes), dwRes);
                    }
                    bResetDcmStatus = EC_FALSE;
                }
                if (eDcmMode_Dcx == eDcmMode)
                {
                EC_T_INT64 nTimeStampDiff = 0;

                    dwRes = ecatDcxGetStatus(&dwDcmStatus, &nDiffCur, &nDiffAvg, &nDiffMax, &nTimeStampDiff);
                    if (EC_E_NOERROR == dwRes)
                    {
                        if (bFirstDcmStatus)
                        {
                            LogMsg("DCX during startup (<INIT> to <%s>)", ecatStateToStr(ecatGetMasterState()));
                        }
                        if ((dwDcmStatus != EC_E_NOTREADY) && (dwDcmStatus != EC_E_BUSY) && (dwDcmStatus != EC_E_NOERROR))
                        {
                            LogMsg("DCX Status: %s (0x%08X)\n", ecatGetText(dwDcmStatus), dwDcmStatus);
                        }
                        if (bLogDcmStatus)
                        {
                            LogMsg("DCX Diff(ns): Cur=%7d, Avg=%7d, Max=%7d, TimeStamp=%7d", nDiffCur, nDiffAvg, nDiffMax, nTimeStampDiff);
                        }
                    }
                    else
                    {
                        if ((eEcatState_OP == ecatGetMasterState()) || (eEcatState_SAFEOP == ecatGetMasterState()))
                        {
                            LogError("Cannot get DCX status! %s (0x%08X)\n", ecatGetText(dwRes), dwRes);
                        }
                        bResetDcmStatus = EC_FALSE;
                    }
                }
                if (bResetDcmStatus)
                {
#if (defined ATECAT_VERSION) && (ATECAT_VERSION >= 0x02040106)
                    ecatDcmResetStatus();
#endif
                    bFirstDcmStatus = EC_FALSE;
                }
            }
        }
        /* process notification jobs */
        pNotification->ProcessNotificationJobs();

        OsSleep(5);
    }

    if (S_bEnaPerfJobs)
    {
        LogMsg("");
        LogMsg("Job times before shutdown");
        PERF_MEASURE_JOBS_SHOW();       /* show job times */
    }

Exit:
    if (0 != nVerbose) LogMsg( "========================" );
    if (0 != nVerbose) LogMsg( "Shutdown EtherCAT Master" );
    if (0 != nVerbose) LogMsg( "========================" );

    /* Stop EtherCAT bus --> Set Master state to INIT */
    dwRes = ecatSetMasterState(ETHERCAT_STATE_CHANGE_TIMEOUT, eEcatState_INIT);
    if (EC_E_NOERROR != dwRes)
    {
        LogError("Cannot stop EtherCAT-Master! %s (0x%lx)", ecatGetText(dwRes), dwRes);
    }
    /* Unregister client */
    if (S_dwClntId != 0)
    {
        dwRes = ecatUnregisterClient(S_dwClntId); 
        if (EC_E_NOERROR != dwRes)
        {
            LogError("Cannot unregister client! %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        S_dwClntId = 0;
    }

#if (defined DEBUG) && (defined XENOMAI)
    /* Disable PRIMARY to SECONDARY MODE switch warning */
    dwRes = rt_task_set_mode(T_WARNSW, 0, NULL);
    if (dwRes != 0)
    {
        OsDbgMsg("OsCreateThread: rt_task_set_mode returned error %d\n", dwRes);
        OsDbgAssert(EC_FALSE);
    }
#endif /* XENOMAI */

    /* Shutdown tEcJobTask */
    S_DemoThreadParam.bJobThreadShutdown = EC_TRUE;
    oTimeout.Start(2000);
    while (S_DemoThreadParam.bJobThreadRunning && !oTimeout.IsElapsed())
    {
        OsSleep(10);
    }
    if (S_pvtJobThread != EC_NULL)
    {
        OsDeleteThreadHandle(S_pvtJobThread);
        S_pvtJobThread = EC_NULL;
    }

#ifdef ATEMRAS_SERVER
    /* Stop RAS server */
    if (S_bRasSrvStarted)
    {
        LogMsg("Stop Remote Api Server\n");
        
        if (EC_E_NOERROR != emRasSrvStop(S_pvRemoteApiSrvH, 2000))
        {
            LogError("Remote API Server shutdown failed\n");
        }
    }
#endif

    /* Deinitialize master */
    LogMsg( "ecatDeinitMaster() should be called here." );
    LogMsg( "But this would provoke a ' double free or corruption (out):' error." );
//     dwRes = ecatDeinitMaster();
    
    if (EC_E_NOERROR != dwRes)
    {
        LogError("Cannot de-initialize EtherCAT-Master! %s (0x%lx)", ecatGetText(dwRes), dwRes);
    }

    if (S_bEnaPerfJobs)
    {
        PERF_MEASURE_JOBS_DEINIT();
    }
    /* delete notification context */
    SafeDelete(pNotification);

    return dwRetVal;
}